

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# laszip_dll.cpp
# Opt level: O1

laszip_I32
laszip_set_geodouble_params(laszip_POINTER pointer,laszip_U32 number,laszip_F64 *geodouble_params)

{
  laszip_I32 lVar1;
  
  if (pointer != (laszip_POINTER)0x0) {
    if (number == 0) {
      builtin_strncpy((char *)((long)pointer + 600),"ble_para",8);
      builtin_strncpy((char *)((long)pointer + 0x260),"ms is ze",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"number o",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"f geodou",8);
      *(undefined4 *)((long)pointer + 0x267) = 0x6f7265;
    }
    else if (geodouble_params == (laszip_F64 *)0x0) {
      builtin_strncpy((char *)((long)pointer + 0x266),"params\' ",8);
      builtin_strncpy((char *)((long)pointer + 0x26e),"is zero",8);
      builtin_strncpy((char *)((long)pointer + 600),"er \'geod",8);
      builtin_strncpy((char *)((long)pointer + 0x260),"ouble_pa",8);
      builtin_strncpy((char *)((long)pointer + 0x248),"laszip_F",8);
      builtin_strncpy((char *)((long)pointer + 0x250),"64 point",8);
    }
    else {
      if (*(long *)((long)pointer + 0x228) == 0) {
        if (*(long *)((long)pointer + 0x238) == 0) {
          lVar1 = laszip_add_vlr(pointer,"LASF_Projection",0x87b0,(short)number * 8,
                                 (laszip_CHAR *)0x0,(laszip_U8 *)geodouble_params);
          if (lVar1 != 0) {
            snprintf((char *)((long)pointer + 0x248),0x400,"setting %u geodouble_params",
                     (ulong)number);
            return 1;
          }
          *(char *)((long)pointer + 0x248) = '\0';
          return 0;
        }
        builtin_strncpy((char *)((long)pointer + 0x268),"r writer",8);
        builtin_strncpy((char *)((long)pointer + 0x270)," was ope",8);
        builtin_strncpy((char *)((long)pointer + 600),"uble_par",8);
        builtin_strncpy((char *)((long)pointer + 0x260),"ams afte",8);
      }
      else {
        builtin_strncpy((char *)((long)pointer + 0x268),"r reader",8);
        builtin_strncpy((char *)((long)pointer + 0x270)," was ope",8);
        builtin_strncpy((char *)((long)pointer + 600),"uble_par",8);
        builtin_strncpy((char *)((long)pointer + 0x260),"ams afte",8);
      }
      builtin_strncpy((char *)((long)pointer + 0x248),"cann",4);
      builtin_strncpy((char *)((long)pointer + 0x24c),"ot s",4);
      builtin_strncpy((char *)((long)pointer + 0x250),"et g",4);
      builtin_strncpy((char *)((long)pointer + 0x254),"eodo",4);
      *(undefined4 *)((long)pointer + 0x278) = 0x64656e;
    }
  }
  return 1;
}

Assistant:

LASZIP_API laszip_I32
laszip_set_geodouble_params(
    laszip_POINTER                     pointer
    , laszip_U32                       number
    , const laszip_F64*                geodouble_params
)
{
  if (pointer == 0) return 1;
  laszip_dll_struct* laszip_dll = (laszip_dll_struct*)pointer;

  try
  {
    if (number == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "number of geodouble_params is zero");
      return 1;
    }

    if (geodouble_params == 0)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "laszip_F64 pointer 'geodouble_params' is zero");
      return 1;
    }

    if (laszip_dll->reader)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geodouble_params after reader was opened");
      return 1;
    }

    if (laszip_dll->writer)
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "cannot set geodouble_params after writer was opened");
      return 1;
    }

    // add the VLR

    if (laszip_add_vlr(laszip_dll, "LASF_Projection", 34736, (laszip_U16)(number*8), 0, (const laszip_U8*)geodouble_params))
    {
      snprintf(laszip_dll->error, sizeof(laszip_dll->error), "setting %u geodouble_params", number);
      return 1;
    }
  }
  catch (...)
  {
    snprintf(laszip_dll->error, sizeof(laszip_dll->error), "internal error in laszip_set_geodouble_params");
    return 1;
  }

  laszip_dll->error[0] = '\0';
  return 0;
}